

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O3

OPJ_SIZE_T opj_read_from_buffer(void *pdst,OPJ_SIZE_T len,opj_buffer_info_t *psrc)

{
  OPJ_BYTE *pOVar1;
  
  pOVar1 = psrc->buf + (psrc->len - (long)psrc->cur);
  if (pOVar1 == (OPJ_BYTE *)0x0) {
    len = 0xffffffffffffffff;
  }
  else {
    if (pOVar1 < len) {
      len = (OPJ_SIZE_T)pOVar1;
    }
    memcpy(pdst,psrc->cur,len);
    psrc->cur = psrc->cur + len;
  }
  return (OPJ_SIZE_T)(OPJ_BYTE *)len;
}

Assistant:

static OPJ_SIZE_T
opj_read_from_buffer (void* pdst, OPJ_SIZE_T len, opj_buffer_info_t* psrc)
{
    OPJ_SIZE_T n = psrc->buf + psrc->len - psrc->cur;

    if (n) {
        if (n > len)
            n = len;

        memcpy (pdst, psrc->cur, n);
        psrc->cur += n;
    }
    else
        n = (OPJ_SIZE_T)-1;

    return n;
}